

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

reference __thiscall
absl::lts_20250127::container_internal::
btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>,_const_google::protobuf::Descriptor_*const_&,_const_google::protobuf::Descriptor_*const_*>
::operator*(btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>,_const_google::protobuf::Descriptor_*const_&,_const_google::protobuf::Descriptor_*const_*>
            *this)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  char *__function;
  btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>,_const_google::protobuf::Descriptor_*const_&,_const_google::protobuf::Descriptor_*const_*>
  *this_00;
  
  this_00 = (btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>,_const_google::protobuf::Descriptor_*const_&,_const_google::protobuf::Descriptor_*const_*>
             *)this->node_;
  if (this_00 ==
      (btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>,_const_google::protobuf::Descriptor_*const_&,_const_google::protobuf::Descriptor_*const_*>
       *)0x0) {
    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>const,google::protobuf::Descriptor_const*const&,google::protobuf::Descriptor_const*const*>
    ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>const,google::protobuf::Descriptor_const*const&,google::protobuf::Descriptor_const*const*>
                 *)0x0);
LAB_00daa444:
    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>const,google::protobuf::Descriptor_const*const&,google::protobuf::Descriptor_const*const*>
    ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>const,google::protobuf::Descriptor_const*const&,google::protobuf::Descriptor_const*const*>
                 *)this_00);
LAB_00daa449:
    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>const,google::protobuf::Descriptor_const*const&,google::protobuf::Descriptor_const*const*>
    ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>const,google::protobuf::Descriptor_const*const&,google::protobuf::Descriptor_const*const*>
                 *)this_00);
LAB_00daa44e:
    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>const,google::protobuf::Descriptor_const*const&,google::protobuf::Descriptor_const*const*>
    ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>const,google::protobuf::Descriptor_const*const&,google::protobuf::Descriptor_const*const*>
                 *)this_00);
  }
  else {
    iVar1 = this->position_;
    bVar2 = btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
            ::start((btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>
                     *)this_00);
    if (iVar1 < (int)(uint)bVar2) goto LAB_00daa444;
    if (((ulong)this->node_ & 7) == 0) {
      if (this->position_ < (int)(uint)(byte)this->node_[10]) {
LAB_00daa425:
        if (((ulong)this->node_ & 7) == 0) {
          return (reference)(this->node_ + (ulong)(byte)this->position_ * 8 + 0x10);
        }
        __function = 
        "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>> *, unsigned int, unsigned char, const google::protobuf::Descriptor *, absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>> *, unsigned int, unsigned char, const google::protobuf::Descriptor *, absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 3UL, Char = const char]"
        ;
        goto LAB_00daa47f;
      }
      this_00 = this;
      bVar3 = IsEndIterator(this);
      if (bVar3) goto LAB_00daa449;
      if (((ulong)this->node_ & 7) != 0) goto LAB_00daa453;
      if (this->position_ < (int)(uint)(byte)this->node_[10]) goto LAB_00daa425;
      goto LAB_00daa44e;
    }
  }
LAB_00daa453:
  __function = 
  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>> *, unsigned int, unsigned char, const google::protobuf::Descriptor *, absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>> *, unsigned int, unsigned char, const google::protobuf::Descriptor *, absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::Descriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::Descriptor *>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 2UL, Char = const char]"
  ;
LAB_00daa47f:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,__function);
}

Assistant:

reference operator*() const {
    ABSL_HARDENING_ASSERT(node_ != nullptr);
    assert_valid_generation(node_);
    ABSL_HARDENING_ASSERT(position_ >= node_->start());
    if (position_ >= node_->finish()) {
      ABSL_HARDENING_ASSERT(!IsEndIterator() && "Dereferencing end() iterator");
      ABSL_HARDENING_ASSERT(position_ < node_->finish());
    }
    return node_->value(static_cast<field_type>(position_));
  }